

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

UTimeZoneNameTypeIndex icu_63::ZNames::getTZNameTypeIndex(UTimeZoneNameType type)

{
  UTimeZoneNameTypeIndex UVar1;
  
  switch(type) {
  case UTZNM_LONG_GENERIC:
  case UTZNM_LONG_STANDARD:
    return type;
  case UTZNM_LONG_DAYLIGHT:
    UVar1 = UTZNM_INDEX_LONG_DAYLIGHT;
    break;
  case UTZNM_SHORT_GENERIC:
    UVar1 = UTZNM_INDEX_SHORT_GENERIC;
    break;
  default:
    if (type == UTZNM_SHORT_STANDARD) {
      return UTZNM_INDEX_SHORT_STANDARD;
    }
    if (type == UTZNM_SHORT_DAYLIGHT) {
      return UTZNM_INDEX_SHORT_DAYLIGHT;
    }
    if (type == UTZNM_EXEMPLAR_LOCATION) {
      return UTZNM_INDEX_EXEMPLAR_LOCATION;
    }
  case UTZNM_LONG_STANDARD|UTZNM_LONG_GENERIC:
  case UTZNM_LONG_DAYLIGHT|UTZNM_LONG_GENERIC:
  case UTZNM_LONG_DAYLIGHT|UTZNM_LONG_STANDARD:
  case UTZNM_LONG_DAYLIGHT|UTZNM_LONG_STANDARD|UTZNM_LONG_GENERIC:
    UVar1 = UTZNM_INDEX_UNKNOWN;
  }
  return UVar1;
}

Assistant:

static UTimeZoneNameTypeIndex getTZNameTypeIndex(UTimeZoneNameType type) {
        switch(type) {
        case UTZNM_EXEMPLAR_LOCATION: return UTZNM_INDEX_EXEMPLAR_LOCATION;
        case UTZNM_LONG_GENERIC: return UTZNM_INDEX_LONG_GENERIC;
        case UTZNM_LONG_STANDARD: return UTZNM_INDEX_LONG_STANDARD;
        case UTZNM_LONG_DAYLIGHT: return UTZNM_INDEX_LONG_DAYLIGHT;
        case UTZNM_SHORT_GENERIC: return UTZNM_INDEX_SHORT_GENERIC;
        case UTZNM_SHORT_STANDARD: return UTZNM_INDEX_SHORT_STANDARD;
        case UTZNM_SHORT_DAYLIGHT: return UTZNM_INDEX_SHORT_DAYLIGHT;
        default: return UTZNM_INDEX_UNKNOWN;
        }
    }